

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

void anon_unknown.dwarf_1f70ea::runtests(bool nonfatal,bool tiny)

{
  int banks;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char **channels;
  char **passivechannels;
  PixelType *pt;
  char **channels_00;
  PixelType *pt_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  Box2i *pBVar10;
  Compression *pCVar11;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *this;
  Header *pHVar12;
  undefined1 nonfatal_00;
  char **passivechannels_00;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  allocator<char> local_339;
  InputFile infile;
  FrameBuffer preReadFrameBuf;
  FrameBuffer readFrameBuf;
  FrameBuffer writeFrameBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  size_type *local_208;
  undefined8 local_200;
  Box2i local_1f8;
  Header hdr;
  ostringstream q;
  
  random_reseed(1);
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  for (lVar14 = 0; lVar14 != 0x23; lVar14 = lVar14 + 1) {
    pcVar1 = (&(anonymous_namespace)::Schemes)[lVar14 * 6];
    for (lVar13 = 0; lVar3 = std::cout, lVar13 != 0x23; lVar13 = lVar13 + 1) {
      pcVar2 = (&(anonymous_namespace)::Schemes)[lVar13 * 6];
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f |
           0x80;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = 2;
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar14);
      poVar9 = std::operator<<(poVar9,',');
      lVar3 = *(long *)poVar9;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar9 + lVar4 + 0x18) = *(uint *)(poVar9 + lVar4 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar9 + *(long *)(lVar3 + -0x18) + 0x10) = 2;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)lVar13);
      std::operator<<(poVar9,": ");
      std::ostream::flush();
      channels = (char **)(&PTR_rgb_004203e8)[lVar14 * 6];
      passivechannels = (char **)(&DAT_004203f0)[lVar14 * 6];
      iVar8 = (&DAT_004203f8)[lVar14 * 0xc];
      puVar15 = (undefined8 *)(&DAT_00420400)[lVar14 * 6];
      pt = (PixelType *)(&DAT_00420408)[lVar14 * 6];
      channels_00 = (char **)(&PTR_rgb_004203e8)[lVar13 * 6];
      passivechannels_00 = (char **)(&DAT_004203f0)[lVar13 * 6];
      banks = (&DAT_004203f8)[lVar13 * 0xc];
      pt_00 = (PixelType *)(&DAT_00420408)[lVar13 * 6];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&q);
      poVar9 = std::operator<<((ostream *)&q,pcVar1);
      poVar9 = std::operator<<(poVar9," read as ");
      poVar9 = std::operator<<(poVar9,pcVar2);
      std::operator<<(poVar9,"...");
      lVar3 = std::cout;
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f |
           0x20;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = 0x35;
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cout,(string *)&hdr);
      std::__cxx11::string::~string((string *)&hdr);
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl._0_8_ = 0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Header::Header
                (&hdr,0x80,0x80,1.0,(V2f *)&readFrameBuf,1.0,INCREASING_Y,ZIP_COMPRESSION);
      iVar6 = random_int(0xc9);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar10->min).x = iVar6 + -100;
      iVar6 = random_int(0xc9);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar10->min).y = iVar6 + -100;
      if (nonfatal) {
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = (pBVar10->min).x;
        iVar7 = random_int(0xe);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar10->max).x = iVar6 + iVar7 + 1;
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = (pBVar10->min).y;
        iVar7 = random_int(0xe);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = iVar6 + iVar7 + 1;
      }
      else {
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = (pBVar10->min).x;
        iVar7 = random_int(400);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar10->max).x = iVar6 + iVar7 + 0x40;
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = (pBVar10->min).y;
        iVar7 = random_int(400);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar6 = iVar6 + iVar7 + 0x40;
      }
      (pBVar10->max).y = iVar6;
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = ZIPS_COMPRESSION;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setupBuffer((ChannelList *)&local_228,&hdr,channels,passivechannels,pt,&writeFrameBuf,
                  &readFrameBuf,&preReadFrameBuf,iVar8,true);
      this = (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)Imf_2_5::Header::channels(&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::operator=(this,(_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                        *)&local_228);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)&local_228);
      if (puVar15 != (undefined8 *)0x0) {
        infile.super_GenericInputFile._vptr_GenericInputFile = (_func_int **)0x0;
        infile._data = (Data *)0x0;
        for (; (char *)*puVar15 != (char *)0x0; puVar15 = puVar15 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,(char *)*puVar15,&local_339);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infile,
                     &local_228);
          std::__cxx11::string::~string((string *)&local_228);
        }
        Imf_2_5::addMultiView(&hdr,(StringVector *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&infile);
      }
      remove((anonymous_namespace)::filename_abi_cxx11_);
      pcVar2 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile((OutputFile *)&local_228,pcVar2,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)&local_228,&writeFrameBuf);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      iVar8 = (pBVar10->max).y;
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      Imf_2_5::OutputFile::writePixels((OutputFile *)&local_228,(iVar8 - (pBVar10->min).y) + 1);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      local_1f8.min = pBVar10->min;
      local_1f8.max = pBVar10->max;
      Imf_2_5::OutputFile::~OutputFile((OutputFile *)&local_228);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      Imf_2_5::Header::~Header(&hdr);
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_228._M_string_length._0_4_ = 0;
      local_228.field_2._M_allocated_capacity = 0;
      local_228.field_2._8_8_ = &local_228._M_string_length;
      local_200 = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_208 = (size_type *)local_228.field_2._8_8_;
      std::ostream::flush();
      pcVar2 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&infile,pcVar2,iVar8);
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      setupBuffer((ChannelList *)&hdr,pHVar12,channels_00,passivechannels_00,pt_00,&readFrameBuf,
                  &preReadFrameBuf,(FrameBuffer *)&local_228,banks,false);
      nonfatal_00 = SUB81(passivechannels_00,0);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)&hdr);
      Imf_2_5::InputFile::setFrameBuffer(&infile,&readFrameBuf);
      std::ostream::flush();
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      pBVar10 = Imf_2_5::Header::dataWindow(pHVar12);
      iVar8 = (pBVar10->min).y;
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      pBVar10 = Imf_2_5::Header::dataWindow(pHVar12);
      Imf_2_5::InputFile::readPixels(&infile,iVar8,(pBVar10->max).y);
      bVar5 = Imf_2_5::InputFile::isOptimizationEnabled(&infile);
      Imf_2_5::InputFile::~InputFile(&infile);
      compare(&readFrameBuf,&writeFrameBuf,&local_1f8,(bool)nonfatal_00);
      compare(&preReadFrameBuf,(FrameBuffer *)&local_228,&local_1f8,(bool)nonfatal_00);
      std::operator<<((ostream *)&std::cout," OK ");
      if (bVar5) {
        std::operator<<((ostream *)&std::cout,"OPTIMISED ");
        (anonymous_namespace)::gOptimisedReads = (anonymous_namespace)::gOptimisedReads + 1;
      }
      std::operator<<((ostream *)&std::cout,"\n");
      (anonymous_namespace)::gSuccesses = (anonymous_namespace)::gSuccesses + 1;
      remove((anonymous_namespace)::filename_abi_cxx11_);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&local_228);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&writeFrameBuf);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&q);
    }
  }
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0);
  poVar9 = std::operator<<(poVar9,'/');
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(anonymous_namespace)::gSuccesses);
  std::operator<<(poVar9," runs failed\n");
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::operator<<(poVar9," tests skipped (assumed to be bad)\n");
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  poVar9 = std::operator<<(poVar9,'/');
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(anonymous_namespace)::gSuccesses);
  std::operator<<(poVar9," optimised\n");
  return;
}

Assistant:

void runtests(bool nonfatal,bool tiny)
{
    random_reseed(1);
    int i=0;
    int skipped=0;
    
    gFailures=0;
    gSuccesses=0;
    gOptimisedReads=0;
    
    
    while(Schemes[i]._name!=NULL)
    {
        int j=0;
        while(Schemes[j]._name!=NULL)
        {
           cout << right << setw(2) << i << ',' << right << setw(2) << j << ": ";
           cout.flush();

           if (nonfatal)
           {
               cout << " skipping " << Schemes[i]._name << ',' << Schemes[j]._name << ": known to crash\n";
               skipped++;
           }
           else
           {
               test(Schemes[i],Schemes[j],nonfatal,tiny);
           }
           j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses+gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";
        
    if (gFailures>0 )
    {
        cout << " TESTS FAILED\n";
        assert(false);
    }
}